

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O0

bool __thiscall
avro::BufferReader::read<unsigned_char>(BufferReader *this,uchar *val,true_type *param_3)

{
  size_type sVar1;
  data_type *pdVar2;
  BufferReader *in_RDX;
  data_type *in_RSI;
  BufferReader *in_RDI;
  BufferReader *this_00;
  bool local_1;
  
  if (in_RDI->bytesRemaining_ == 0) {
    local_1 = false;
  }
  else {
    this_00 = in_RDI;
    sVar1 = chunkRemaining(in_RDX);
    if (sVar1 == 0) {
      read(in_RDI,(int)in_RSI,(void *)0x1,0);
    }
    else {
      pdVar2 = addr(in_RDX);
      *in_RSI = *pdVar2;
      incrementChunk(this_00,(size_type)in_RSI);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool read(T &val, const boost::true_type&)
    {
        if(sizeof(T) > bytesRemaining_) {
            return false;
        }

        if (sizeof(T) <= chunkRemaining()) {
            val = *(reinterpret_cast<const T*> (addr()));
            incrementChunk(sizeof(T));
        }
        else {
            read(reinterpret_cast<data_type *>(&val), sizeof(T));
        }
        return true;
    }